

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double incircleexact(double *pa,double *pb,double *pc,double *pd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double local_2c68;
  double local_2c58;
  double local_2c48;
  double local_2c38;
  double dStack_2ba0;
  double dStack_2b60;
  double dStack_2b50;
  double local_2b38 [4];
  double local_2b18 [4];
  undefined1 local_2af8 [16];
  double local_2ae8;
  double local_2ae0;
  double local_2ad8;
  double dStack_2ad0;
  double local_2ac8;
  double local_2ac0;
  double local_2ab8;
  double dStack_2ab0;
  double local_2aa8;
  double local_2aa0;
  double temp8 [8];
  double local_2a58;
  double dStack_2a50;
  double local_2a48;
  double local_2a40;
  double dab [12];
  double cda [12];
  double abc [12];
  double det24y [24];
  double det24x [24];
  double bcd [12];
  double det48x [48];
  double cdet [96];
  double bdet [96];
  double adet [96];
  double det48y [48];
  double ddet [96];
  double deter [384];
  double cddet [192];
  double abdet [192];
  
  dVar33 = *pb;
  dVar36 = pb[1];
  auVar4 = *(undefined1 (*) [16])pb;
  dVar28 = *pa;
  dVar29 = pa[1];
  auVar5 = *(undefined1 (*) [16])pa;
  dVar18 = dVar36 * dVar28;
  dVar21 = dVar33 * dVar29;
  dVar17 = splitter * dVar36 - (splitter * dVar36 - dVar36);
  dVar20 = splitter * dVar33 - (splitter * dVar33 - dVar33);
  dVar22 = dVar36 - dVar17;
  dVar24 = dVar33 - dVar20;
  dVar31 = splitter * dVar28 - (splitter * dVar28 - dVar28);
  dVar34 = splitter * dVar29 - (splitter * dVar29 - dVar29);
  dVar43 = dVar28 - dVar31;
  dVar44 = dVar29 - dVar34;
  dVar23 = dVar22 * dVar43 - (((dVar18 - dVar31 * dVar17) - dVar43 * dVar17) - dVar22 * dVar31);
  dVar25 = dVar24 * dVar44 - (((dVar21 - dVar20 * dVar34) - dVar24 * dVar34) - dVar44 * dVar20);
  dVar26 = dVar23 - dVar25;
  dVar14 = dVar18 + dVar26;
  dVar18 = (dVar18 - (dVar14 - (dVar14 - dVar18))) + (dVar26 - (dVar14 - dVar18));
  dVar19 = dVar18 - dVar21;
  dVar31 = -dVar31;
  dVar20 = -dVar20;
  local_2ab8 = (dVar23 - (dVar26 + (dVar23 - dVar26))) + ((dVar23 - dVar26) - dVar25);
  dStack_2ab0 = (dVar18 - (dVar19 + (dVar18 - dVar19))) + ((dVar18 - dVar19) - dVar21);
  local_2aa0 = dVar14 + dVar19;
  local_2aa8 = (dVar14 - (local_2aa0 - (local_2aa0 - dVar14))) + (dVar19 - (local_2aa0 - dVar14));
  dVar23 = *pc;
  dVar25 = pc[1];
  auVar7 = *(undefined1 (*) [16])pc;
  dVar27 = splitter * dVar23 - (splitter * dVar23 - dVar23);
  dVar30 = splitter * dVar25 - (splitter * dVar25 - dVar25);
  dVar26 = *pd;
  dVar37 = pd[1];
  auVar6 = *(undefined1 (*) [16])pd;
  dVar38 = splitter * dVar37 - (splitter * dVar37 - dVar37);
  dVar39 = splitter * dVar26 - (splitter * dVar26 - dVar26);
  dVar15 = -dVar27;
  dVar16 = -dVar39;
  auVar1._8_4_ = SUB84(dVar39,0);
  auVar1._0_8_ = dVar31;
  auVar1._12_4_ = (int)((ulong)dVar16 >> 0x20);
  dVar18 = dVar23 - dVar27;
  dVar19 = dVar25 - dVar30;
  auVar2._8_4_ = SUB84(dVar15,0);
  auVar2._0_8_ = dVar31;
  auVar2._12_4_ = (int)((ulong)dVar15 >> 0x20);
  dVar46 = -dVar24;
  dVar32 = dVar37 - dVar38;
  dVar35 = dVar26 - dVar39;
  auVar3._8_4_ = SUB84(dVar35,0);
  auVar3._0_8_ = dVar46;
  auVar3._12_4_ = (int)((ulong)-dVar35 >> 0x20);
  dVar21 = dVar36 * dVar23;
  dVar14 = dVar33 * dVar25;
  dVar41 = dVar22 * dVar18 - (dVar15 * dVar22 + -dVar18 * dVar17 + dVar15 * dVar17 + dVar21);
  dVar42 = dVar24 * dVar19 - (dVar19 * dVar20 + dVar30 * dVar46 + dVar30 * dVar20 + dVar14);
  dVar40 = dVar42 - dVar41;
  dVar45 = dVar14 + dVar40;
  dVar14 = (dVar14 - (dVar45 - (dVar45 - dVar14))) + (dVar40 - (dVar45 - dVar14));
  dVar15 = dVar14 - dVar21;
  dVar21 = (dVar14 - ((dVar14 - dVar15) + dVar15)) + ((dVar14 - dVar15) - dVar21);
  local_2af8._8_4_ = SUB84(dVar21,0);
  local_2af8._0_8_ = (dVar42 - (dVar40 + (dVar42 - dVar40))) + ((dVar42 - dVar40) - dVar41);
  local_2af8._12_4_ = (int)((ulong)dVar21 >> 0x20);
  local_2ae0 = dVar45 + dVar15;
  local_2ae8 = (dVar45 - (local_2ae0 - (local_2ae0 - dVar45))) + (dVar15 - (local_2ae0 - dVar45));
  dVar14 = dVar23 * dVar37;
  dVar15 = dVar25 * dVar26;
  dVar40 = dVar18 * dVar32 - (((dVar14 - dVar27 * dVar38) - dVar38 * dVar18) - dVar32 * dVar27);
  dVar41 = dVar19 * dVar35 - (((dVar15 - dVar39 * dVar30) - dVar30 * dVar35) - dVar19 * dVar39);
  dVar27 = dVar40 - dVar41;
  dVar21 = dVar14 + dVar27;
  dVar14 = (dVar14 - (dVar21 - (dVar21 - dVar14))) + (dVar27 - (dVar21 - dVar14));
  dVar39 = dVar14 - dVar15;
  local_2ad8 = (dVar40 - (dVar27 + (dVar40 - dVar27))) + ((dVar40 - dVar27) - dVar41);
  dStack_2ad0 = (dVar14 - (dVar39 + (dVar14 - dVar39))) + ((dVar14 - dVar39) - dVar15);
  local_2ac0 = dVar21 + dVar39;
  local_2ac8 = (dVar21 - (local_2ac0 - (local_2ac0 - dVar21))) + (dVar39 - (local_2ac0 - dVar21));
  dStack_2b50 = auVar1._8_8_;
  dVar27 = dVar28 * dVar37;
  dVar21 = dVar29 * dVar26;
  dVar40 = dVar43 * dVar32 - (dVar32 * dVar31 + -dVar43 * dVar38 + dVar31 * dVar38 + dVar27);
  dVar41 = dVar44 * dVar35 -
           (dVar44 * dStack_2b50 + -dVar35 * dVar34 + dStack_2b50 * dVar34 + dVar21);
  dVar39 = dVar41 - dVar40;
  dVar15 = dVar21 + dVar39;
  dVar21 = (dVar21 - (dVar15 - (dVar15 - dVar21))) + (dVar39 - (dVar15 - dVar21));
  dVar14 = dVar21 - dVar27;
  local_2a58 = (dVar41 - (dVar39 + (dVar41 - dVar39))) + ((dVar41 - dVar39) - dVar40);
  dStack_2a50 = (dVar21 - ((dVar21 - dVar14) + dVar14)) + ((dVar21 - dVar14) - dVar27);
  local_2a40 = dVar15 + dVar14;
  local_2a48 = (dVar15 - (local_2a40 - (local_2a40 - dVar15))) + (dVar14 - (local_2a40 - dVar15));
  dStack_2b60 = auVar2._8_8_;
  dVar25 = dVar25 * dVar28;
  dVar23 = dVar23 * dVar29;
  dVar21 = dVar19 * dVar43 - (dVar19 * dVar31 + -dVar43 * dVar30 + dVar31 * dVar30 + dVar25);
  dVar18 = dVar18 * dVar44 -
           (dVar44 * dStack_2b60 + -dVar18 * dVar34 + dStack_2b60 * dVar34 + dVar23);
  dVar19 = dVar21 - dVar18;
  dVar14 = dVar25 + dVar19;
  dVar28 = (dVar25 - (dVar14 - (dVar14 - dVar25))) + (dVar19 - (dVar14 - dVar25));
  dVar29 = dVar28 - dVar23;
  local_2b18[0] = (dVar21 - (dVar19 + (dVar21 - dVar19))) + ((dVar21 - dVar19) - dVar18);
  local_2b18[1] = (dVar28 - (dVar29 + (dVar28 - dVar29))) + ((dVar28 - dVar29) - dVar23);
  local_2b18[3] = dVar14 + dVar29;
  local_2b18[2] =
       (dVar14 - (local_2b18[3] - (local_2b18[3] - dVar14))) + (dVar29 - (local_2b18[3] - dVar14));
  dVar37 = dVar37 * dVar33;
  dVar26 = dVar26 * dVar36;
  dStack_2ba0 = auVar3._8_8_;
  dVar33 = dVar24 * dVar32 - (dVar32 * dVar20 + dVar46 * dVar38 + dVar20 * dVar38 + dVar37);
  dVar36 = dVar22 * dVar35 - (dVar22 * dVar16 + dStack_2ba0 * dVar17 + dVar16 * dVar17 + dVar26);
  dVar19 = dVar33 - dVar36;
  dVar18 = dVar37 + dVar19;
  dVar21 = (dVar37 - (dVar18 - (dVar18 - dVar37))) + (dVar19 - (dVar18 - dVar37));
  dVar14 = dVar21 - dVar26;
  local_2b38[0] = (dVar33 - (dVar19 + (dVar33 - dVar19))) + ((dVar33 - dVar19) - dVar36);
  local_2b38[1] = (dVar21 - (dVar14 + (dVar21 - dVar14))) + ((dVar21 - dVar14) - dVar26);
  local_2b38[3] = dVar18 + dVar14;
  local_2b38[2] =
       (dVar18 - (local_2b38[3] - (local_2b38[3] - dVar18))) + (dVar14 - (local_2b38[3] - dVar18));
  iVar8 = fast_expansion_sum_zeroelim(4,&local_2ad8,4,&local_2a58,temp8);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp8,4,local_2b18,cda);
  iVar9 = fast_expansion_sum_zeroelim(4,&local_2a58,4,&local_2ab8,temp8);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,temp8,4,local_2b38,dab);
  for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
    local_2b38[lVar13] = -local_2b38[lVar13];
    local_2b18[lVar13] = -local_2b18[lVar13];
  }
  iVar10 = fast_expansion_sum_zeroelim(4,&local_2ab8,4,(double *)local_2af8,temp8);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,temp8,4,local_2b18,abc);
  iVar11 = fast_expansion_sum_zeroelim(4,(double *)local_2af8,4,&local_2ad8,temp8);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,temp8,4,local_2b38,bcd);
  local_2c68 = auVar5._0_8_;
  iVar12 = scale_expansion_zeroelim(iVar11,bcd,local_2c68,det24x);
  iVar12 = scale_expansion_zeroelim(iVar12,det24x,local_2c68,det48x);
  dVar18 = auVar5._8_8_;
  iVar11 = scale_expansion_zeroelim(iVar11,bcd,dVar18,det24y);
  iVar11 = scale_expansion_zeroelim(iVar11,det24y,dVar18,det48y);
  iVar11 = fast_expansion_sum_zeroelim(iVar12,det48x,iVar11,det48y,adet);
  local_2c58 = auVar4._0_8_;
  iVar12 = scale_expansion_zeroelim(iVar8,cda,local_2c58,det24x);
  iVar12 = scale_expansion_zeroelim(iVar12,det24x,-local_2c58,det48x);
  dVar18 = auVar4._8_8_;
  iVar8 = scale_expansion_zeroelim(iVar8,cda,dVar18,det24y);
  iVar8 = scale_expansion_zeroelim(iVar8,det24y,-dVar18,det48y);
  iVar8 = fast_expansion_sum_zeroelim(iVar12,det48x,iVar8,det48y,bdet);
  local_2c48 = auVar7._0_8_;
  iVar12 = scale_expansion_zeroelim(iVar9,dab,local_2c48,det24x);
  iVar12 = scale_expansion_zeroelim(iVar12,det24x,local_2c48,det48x);
  dVar18 = auVar7._8_8_;
  iVar9 = scale_expansion_zeroelim(iVar9,dab,dVar18,det24y);
  iVar9 = scale_expansion_zeroelim(iVar9,det24y,dVar18,det48y);
  iVar9 = fast_expansion_sum_zeroelim(iVar12,det48x,iVar9,det48y,cdet);
  local_2c38 = auVar6._0_8_;
  iVar12 = scale_expansion_zeroelim(iVar10,abc,local_2c38,det24x);
  iVar12 = scale_expansion_zeroelim(iVar12,det24x,-local_2c38,det48x);
  dVar18 = auVar6._8_8_;
  iVar10 = scale_expansion_zeroelim(iVar10,abc,dVar18,det24y);
  iVar10 = scale_expansion_zeroelim(iVar10,det24y,-dVar18,det48y);
  iVar10 = fast_expansion_sum_zeroelim(iVar12,det48x,iVar10,det48y,ddet);
  iVar8 = fast_expansion_sum_zeroelim(iVar11,adet,iVar8,bdet,abdet);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,cdet,iVar10,ddet,cddet);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,abdet,iVar9,cddet,deter);
  return ddet[(long)iVar8 + 0x5f];
}

Assistant:

REAL incircleexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL det24x[24], det24y[24], det48x[48], det48y[48];
  int xlen, ylen;
  REAL adet[96], bdet[96], cdet[96], ddet[96];
  int alen, blen, clen, dlen;
  REAL abdet[192], cddet[192];
  int ablen, cdlen;
  REAL deter[384];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  xlen = scale_expansion_zeroelim(bcdlen, bcd, pa[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pa[0], det48x);
  ylen = scale_expansion_zeroelim(bcdlen, bcd, pa[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pa[1], det48y);
  alen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, adet);

  xlen = scale_expansion_zeroelim(cdalen, cda, pb[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pb[0], det48x);
  ylen = scale_expansion_zeroelim(cdalen, cda, pb[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pb[1], det48y);
  blen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, bdet);

  xlen = scale_expansion_zeroelim(dablen, dab, pc[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pc[0], det48x);
  ylen = scale_expansion_zeroelim(dablen, dab, pc[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pc[1], det48y);
  clen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, cdet);

  xlen = scale_expansion_zeroelim(abclen, abc, pd[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pd[0], det48x);
  ylen = scale_expansion_zeroelim(abclen, abc, pd[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pd[1], det48y);
  dlen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}